

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

string * __thiscall
testing::TestPartResult::ExtractSummary_abi_cxx11_
          (string *__return_storage_ptr__,TestPartResult *this,char *message)

{
  char *pcVar1;
  allocator<char> local_19;
  
  pcVar1 = strstr((char *)this,"\nStack trace:\n");
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_19);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestPartResult::ExtractSummary(const char* message) {
  const char* const stack_trace = strstr(message, internal::kStackTraceMarker);
  return stack_trace == NULL ? message :
      std::string(message, stack_trace);
}